

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void state_BREAKC(Context *ctx)

{
  int iVar1;
  Context *ctx_local;
  
  iVar1 = replicate_swizzle(ctx->source_args[0].swizzle);
  if (iVar1 == 0) {
    fail(ctx,"BREAKC src1 must have replicate swizzle");
  }
  else {
    iVar1 = replicate_swizzle(ctx->source_args[1].swizzle);
    if (iVar1 == 0) {
      fail(ctx,"BREAKC src2 must have replicate swizzle");
    }
    else if ((ctx->loops == 0) && (ctx->reps == 0)) {
      fail(ctx,"BREAKC outside LOOP/ENDLOOP or REP/ENDREP");
    }
  }
  return;
}

Assistant:

static void state_BREAKC(Context *ctx)
{
    if (!replicate_swizzle(ctx->source_args[0].swizzle))
        fail(ctx, "BREAKC src1 must have replicate swizzle");
    else if (!replicate_swizzle(ctx->source_args[1].swizzle))
        fail(ctx, "BREAKC src2 must have replicate swizzle");
    else if ((ctx->loops == 0) && (ctx->reps == 0))
        fail(ctx, "BREAKC outside LOOP/ENDLOOP or REP/ENDREP");
}